

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_compress(uint8_t *public_key,uint8_t *compressed,uECC_Curve curve)

{
  char local_21;
  wordcount_t i;
  uECC_Curve curve_local;
  uint8_t *compressed_local;
  uint8_t *public_key_local;
  
  for (local_21 = '\0'; local_21 < curve->num_bytes; local_21 = local_21 + '\x01') {
    compressed[local_21 + 1] = public_key[local_21];
  }
  *compressed = (public_key[curve->num_bytes * 2 + -1] & 1) + 2;
  return;
}

Assistant:

void uECC_compress(const uint8_t *public_key, uint8_t *compressed, uECC_Curve curve) {
    wordcount_t i;
    for (i = 0; i < curve->num_bytes; ++i) {
        compressed[i+1] = public_key[i];
    }
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    compressed[0] = 2 + (public_key[curve->num_bytes] & 0x01);
#else
    compressed[0] = 2 + (public_key[curve->num_bytes * 2 - 1] & 0x01);
#endif
}